

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockActualCall.cpp
# Opt level: O2

MockActualCall * __thiscall
MockActualCallTrace::withUnsignedLongIntParameter
          (MockActualCallTrace *this,SimpleString *name,unsigned_long value)

{
  SimpleString local_60;
  SimpleString local_50;
  SimpleString local_40;
  SimpleString local_30;
  SimpleString local_20;
  
  addParameterName(this,name);
  ::StringFrom((unsigned_long)&local_40);
  SimpleString::SimpleString(&local_50," ");
  SimpleString::operator+(&local_30,&local_40);
  BracketsFormattedHexStringFrom((unsigned_long)&local_60);
  SimpleString::operator+(&local_20,&local_30);
  SimpleString::operator+=(&this->traceBuffer_,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::~SimpleString(&local_60);
  SimpleString::~SimpleString(&local_30);
  SimpleString::~SimpleString(&local_50);
  SimpleString::~SimpleString(&local_40);
  return &this->super_MockActualCall;
}

Assistant:

MockActualCall& MockActualCallTrace::withUnsignedLongIntParameter(const SimpleString& name, unsigned long int value)
{
    addParameterName(name);
    traceBuffer_ += StringFrom(value) + " " + BracketsFormattedHexStringFrom(value);
    return *this;
}